

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O3

void test_init_start_stop_destroy_multiple_streams(int early,int delay_ms)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  anon_enum_32 *__s2;
  undefined8 in_RCX;
  anon_enum_32 *paVar5;
  cubeb_stream **rhs;
  long lVar6;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  cubeb *message;
  cubeb_stream **stream_00;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  int r;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  int local_b4;
  AssertHelper local_b0;
  cubeb *ctx;
  uint local_9c;
  cubeb_stream_params local_98;
  cubeb_stream *stream [8];
  
  local_b4 = early;
  pcVar4 = getenv("CUBEB_BACKEND");
  iVar2 = cubeb_init(&ctx,"test_sanity",pcVar4);
  paVar5 = (anon_enum_32 *)CONCAT71((int7)((ulong)in_RCX >> 8),pcVar4 == (char *)0x0 || iVar2 != 0);
  if (pcVar4 != (char *)0x0 && iVar2 == 0) {
    __s2 = (anon_enum_32 *)cubeb_get_backend_id(ctx);
    iVar3 = strcmp(pcVar4,(char *)__s2);
    if (iVar3 != 0) {
      fprintf(_stderr,"Requested backend `%s\', got `%s\'\n",pcVar4);
      paVar5 = __s2;
    }
  }
  local_98._0_8_ = (ulong)local_98.rate << 0x20;
  r = iVar2;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            ((char *)stream,(char *)&r,(int *)&local_98,paVar5);
  if ((char)stream[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x14cae3;
    }
    else {
      message = stream[1]->context;
    }
    iVar2 = 0x124;
  }
  else {
    if (stream[1] != (cubeb_stream *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(stream + 1),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)stream[1]);
    }
    local_98._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)stream,"ctx","nullptr",&ctx,(void **)&local_98);
    if ((char)stream[0] != '\0') {
      local_9c = delay_ms;
      if (stream[1] != (cubeb_stream *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(stream + 1),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)stream[1])
        ;
      }
      local_98._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0xac4400000000;
      local_98.channels = 1;
      local_98.layout = 4;
      local_98.prefs = CUBEB_STREAM_PREF_NONE;
      lVar6 = 0;
LAB_0010d22a:
      do {
        stream_00 = stream + lVar6;
        paVar5 = (anon_enum_32 *)0x0;
        r = cubeb_stream_init(ctx,stream_00,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                              (cubeb_devid)0x0,&local_98,0x113a,test_data_callback,
                              test_state_callback,&dummy);
        local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffff00000000;
        testing::internal::EqHelper::
        Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                  ((char *)&local_c8,(char *)&r,(int *)&local_d8,paVar5);
        if (local_c8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_c0->_M_dataplus)._M_p;
          }
          iVar2 = 0x131;
LAB_0010d679:
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_sanity.cpp"
                     ,iVar2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_d8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_d8._M_head_impl + 8))();
          }
          if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            return;
          }
          this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0;
          goto LAB_0010d571;
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        local_d8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        rhs = stream_00;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&local_c8,"stream[i]","nullptr",stream_00,&local_d8._M_head_impl);
        if (local_c8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_c0->_M_dataplus)._M_p;
          }
          iVar2 = 0x132;
          goto LAB_0010d679;
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        if (local_b4 == 0) {
          lVar6 = lVar6 + 1;
          if (lVar6 == 8) {
            lVar6 = 0;
            goto LAB_0010d368;
          }
          goto LAB_0010d22a;
        }
        r = cubeb_stream_start(*stream_00);
        local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffff00000000;
        testing::internal::EqHelper::
        Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                  ((char *)&local_c8,(char *)&r,(int *)&local_d8,(anon_enum_32 *)rhs);
        if (local_c8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_d8);
          if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_c0->_M_dataplus)._M_p;
          }
          iVar2 = 0x135;
          goto LAB_0010d679;
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      goto LAB_0010d3b1;
    }
    testing::Message::Message((Message *)&local_98);
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x14cae3;
    }
    else {
      message = stream[1]->context;
    }
    iVar2 = 0x125;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_sanity.cpp"
             ,iVar2,(char *)message);
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98._0_8_ + 8))();
  }
  if (stream[1] == (cubeb_stream *)0x0) {
    return;
  }
  this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(stream + 1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)stream[1];
LAB_0010d571:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this,local_c0);
  return;
  while( true ) {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) break;
LAB_0010d368:
    r = cubeb_stream_start(stream[lVar6]);
    local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffff00000000;
    testing::internal::EqHelper::
    Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
              ((char *)&local_c8,(char *)&r,(int *)&local_d8,(anon_enum_32 *)rhs);
    if (local_c8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_c0->_M_dataplus)._M_p;
      }
      iVar2 = 0x13c;
      goto LAB_0010d74c;
    }
  }
LAB_0010d3b1:
  uVar1 = local_9c;
  if (local_9c != 0) {
    sleep(local_9c / 1000);
    usleep((uVar1 % 1000) * 1000);
  }
  if (local_b4 == 0) {
    lVar6 = 0;
    do {
      r = cubeb_stream_stop(stream[lVar6]);
      local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffff00000000;
      testing::internal::EqHelper::
      Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                ((char *)&local_c8,(char *)&r,(int *)&local_d8,(anon_enum_32 *)rhs);
      if (local_c8.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_c0->_M_dataplus)._M_p;
        }
        iVar2 = 0x147;
        goto LAB_0010d74c;
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
  }
  lVar6 = 0;
  do {
    if (local_b4 != 0) {
      r = cubeb_stream_stop(stream[lVar6]);
      local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffff00000000;
      testing::internal::EqHelper::
      Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                ((char *)&local_c8,(char *)&r,(int *)&local_d8,(anon_enum_32 *)rhs);
      if (local_c8.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_d8);
        if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_c0->_M_dataplus)._M_p;
        }
        iVar2 = 0x14e;
LAB_0010d74c:
        this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c0;
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_sanity.cpp"
                   ,iVar2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_d8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        }
        if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        goto LAB_0010d571;
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
    }
    cubeb_stream_destroy(stream[lVar6]);
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      cubeb_destroy(ctx);
      return;
    }
  } while( true );
}

Assistant:

static void
test_init_start_stop_destroy_multiple_streams(int early, int delay_ms)
{
  size_t i;
  int r;
  cubeb * ctx;
  cubeb_stream * stream[8];
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    r = cubeb_stream_init(ctx, &stream[i], "test", NULL, NULL, NULL, &params,
                          STREAM_LATENCY, test_data_callback,
                          test_state_callback, &dummy);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(stream[i], nullptr);
    if (early) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (delay_ms) {
    delay(delay_ms);
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    if (early) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
    cubeb_stream_destroy(stream[i]);
  }

  cubeb_destroy(ctx);
}